

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O2

void test_ADynArray_appendADynArray_failure_nullptrDestArray_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *__s2;
  char *pcVar3;
  char *expr;
  void *_ck_x;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  __s2 = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  builtin_strncpy(__s2,"012",4);
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  bVar1 = private_ACUtils_ADynArray_insertArray((void *)0x0,0xffffffffffffffff,__s2,3,1);
  if (bVar1 == false) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x636);
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x637);
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x638);
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x639);
    iVar2 = strcmp("012",__s2);
    if (iVar2 == 0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x63a);
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x63b);
      if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x63c);
        private_ACUtilsTest_ADynArray_free(__s2);
        return;
      }
      pcVar7 = (char *)0x0;
      pcVar8 = (char *)0x0;
      __s2 = "0";
      expr = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar4 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
      pcVar5 = "private_ACUtilsTest_ADynArray_reallocCount";
      iVar2 = 0x63c;
      pcVar6 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
    }
    else {
      pcVar8 = "\"012\"";
      pcVar7 = "\"";
      pcVar6 = "\"";
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar4 = "srcArray.buffer == \"012\"";
      pcVar5 = "srcArray.buffer";
      iVar2 = 0x63a;
    }
  }
  else {
    pcVar6 = (char *)(ulong)bVar1;
    pcVar7 = (char *)0x0;
    pcVar8 = (char *)0x0;
    __s2 = "false";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar4 = 
    "(&srcArray == ((void*)0) ? destArrayPtr != ((void*)0) : private_ACUtils_ADynArray_insertArray(destArrayPtr, ((size_t)-1), (&srcArray)->buffer, (&srcArray)->size, sizeof(*(destArrayPtr)->buffer))) == false"
    ;
    pcVar5 = 
    "(&srcArray == ((void*)0) ? destArrayPtr != ((void*)0) : private_ACUtils_ADynArray_insertArray(destArrayPtr, ((size_t)-1), (&srcArray)->buffer, (&srcArray)->size, sizeof(*(destArrayPtr)->buffer)))"
    ;
    iVar2 = 0x636;
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,expr,pcVar3,pcVar4,pcVar5,pcVar6,__s2,pcVar7,pcVar8);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_appendADynArray_failure_nullptrDestArray)
{
    struct private_ACUtilsTest_ADynArray_CharArray srcArray = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    struct private_ACUtilsTest_ADynArray_CharArray *destArrayPtr = nullptr;
    srcArray.size = 3;
    srcArray.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    srcArray.capacity = 8;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    srcArray.buffer = (char*) srcArray.reallocator(nullptr, srcArray.capacity);
    memcpy(srcArray.buffer, "012", 4);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_appendADynArray(destArrayPtr, &srcArray), false);
    ACUTILSTEST_ASSERT_UINT_EQ(srcArray.size, 3);
    ACUTILSTEST_ASSERT_UINT_EQ(srcArray.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(srcArray.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(srcArray.buffer, "012");
    ACUTILSTEST_ASSERT_PTR_NONNULL(srcArray.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    srcArray.deallocator(srcArray.buffer);
}